

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void handleSelectionRequest(XEvent *event)

{
  uchar *puVar1;
  Atom AVar2;
  Atom AVar3;
  uchar *puVar4;
  Display *pDVar5;
  PFN_XChangeProperty p_Var6;
  size_t sVar7;
  Atom AVar8;
  long lVar9;
  Window WVar10;
  ulong uVar11;
  Atom *pAVar12;
  int iVar13;
  uchar *local_168;
  uchar *local_160;
  Atom formats [2];
  int actualFormat;
  unsigned_long local_128;
  unsigned_long itemCount;
  Atom targets [4];
  XEvent reply;
  
  AVar8 = 0;
  memset(&reply,0,0xc0);
  p_Var6 = _glfw.x11.xlib.ChangeProperty;
  pDVar5 = _glfw.x11.display;
  reply.type = 0x1f;
  formats[0] = _glfw.x11.UTF8_STRING;
  formats[1] = 0x1f;
  AVar2 = (event->xselectionrequest).property;
  if (AVar2 == 0) goto LAB_001d67e4;
  AVar3 = (event->xselectionrequest).target;
  if (AVar3 == _glfw.x11.TARGETS) {
    pAVar12 = targets;
    targets[0] = _glfw.x11.TARGETS;
    targets[1] = _glfw.x11.MULTIPLE;
    targets[2] = _glfw.x11.UTF8_STRING;
    targets[3] = 0x1f;
    WVar10 = (event->xkey).root;
    iVar13 = 4;
    AVar8 = 4;
LAB_001d6687:
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,WVar10,AVar2,AVar8,0x20,0,(uchar *)pAVar12,iVar13);
  }
  else {
    puVar4 = *(uchar **)
              ((long)_glfw.x11.keynames +
              (ulong)((event->xkey).subwindow != _glfw.x11.PRIMARY) * 8 + -0x10);
    local_160 = puVar4;
    if (AVar3 != _glfw.x11.MULTIPLE) {
      if (AVar3 != _glfw.x11.SAVE_TARGETS) {
        AVar8 = 0;
        lVar9 = 0;
        do {
          if (AVar3 == formats[lVar9]) {
            WVar10 = (event->xkey).root;
            sVar7 = strlen((char *)puVar4);
            (*p_Var6)(pDVar5,WVar10,AVar2,AVar3,8,0,puVar4,(int)sVar7);
            AVar8 = (event->xselectionrequest).property;
            break;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 == 1);
        goto LAB_001d67e4;
      }
      WVar10 = (event->xkey).root;
      iVar13 = 0;
      pAVar12 = (Atom *)0x0;
      AVar8 = _glfw.x11.NULL_;
      goto LAB_001d6687;
    }
    (*_glfw.x11.xlib.GetWindowProperty)
              (_glfw.x11.display,(event->xkey).root,AVar2,0,0x7fffffffffffffff,0,_glfw.x11.ATOM_PAIR
               ,targets,&actualFormat,&itemCount,&local_128,&local_168);
    puVar4 = local_160;
    if (itemCount != 0) {
      uVar11 = 0;
      do {
        p_Var6 = _glfw.x11.xlib.ChangeProperty;
        pDVar5 = _glfw.x11.display;
        AVar2 = *(Atom *)(local_168 + uVar11 * 8);
        lVar9 = 0;
        do {
          if (AVar2 == formats[lVar9]) {
            WVar10 = (event->xkey).root;
            AVar8 = *(Atom *)(local_168 + uVar11 * 8 + 8);
            sVar7 = strlen((char *)puVar4);
            (*p_Var6)(pDVar5,WVar10,AVar8,AVar2,8,0,puVar4,(int)sVar7);
            goto LAB_001d6795;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 == 1);
        puVar1 = local_168 + uVar11 * 8 + 8;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
LAB_001d6795:
        uVar11 = uVar11 + 2;
      } while (uVar11 < itemCount);
    }
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
               _glfw.x11.ATOM_PAIR,0x20,0,local_168,(int)itemCount);
    (*_glfw.x11.xlib.Free)(local_168);
  }
  AVar8 = (event->xselectionrequest).property;
LAB_001d67e4:
  reply.xany.display = (event->xany).display;
  reply.xany.window = (event->xkey).root;
  reply.xkey.root = (event->xkey).subwindow;
  reply.xkey.subwindow = (event->xkey).time;
  reply.xselectionrequest.property = (event->xconfigure).above;
  reply.xkey.time = AVar8;
  (*_glfw.x11.xlib.SendEvent)(_glfw.x11.display,reply.xany.window,0,0,&reply);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply = { SelectionNotify };
    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}